

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsModule.cpp
# Opt level: O3

void __thiscall Js::AsmJsModuleInfo::SetFunctionTableCount(AsmJsModuleInfo *this,int val)

{
  code *pcVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  Recycler *this_00;
  ModuleFunctionTable *pMVar6;
  ulong uVar7;
  Type *pTVar8;
  ulong uVar9;
  Type *addr;
  size_t sVar10;
  size_t size;
  undefined1 auVar11 [16];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined8 extraout_XMM1_Qa_01;
  undefined1 in_XMM1 [16];
  undefined8 extraout_XMM1_Qb;
  undefined8 extraout_XMM1_Qb_00;
  undefined8 extraout_XMM1_Qb_01;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 local_58 [8];
  TrackAllocData data;
  
  if ((this->mFunctionTables).ptr != (ModuleFunctionTable *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    in_XMM1._8_8_ = extraout_XMM1_Qb;
    in_XMM1._0_8_ = extraout_XMM1_Qa;
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
                                ,0x675,"(mFunctionTables == nullptr)","mFunctionTables == nullptr");
    if (!bVar3) goto LAB_00946c27;
    *puVar5 = 0;
  }
  this->mFunctionTableCount = val;
  sVar10 = (size_t)val;
  local_58 = (undefined1  [8])&ModuleFunctionTable::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_46b2372;
  data.filename._0_4_ = 0x677;
  data.plusSize = sVar10;
  this_00 = Memory::Recycler::TrackAllocInfo(this->mRecycler,(TrackAllocData *)local_58);
  if (val == 0) {
    Memory::Recycler::ClearTrackAllocInfo(this_00,(TrackAllocData *)0x0);
    pMVar6 = (ModuleFunctionTable *)&DAT_00000008;
  }
  else {
    size = 0xffffffffffffffff;
    if (-1 < val) {
      size = sVar10 << 4;
    }
    BVar4 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      in_XMM1._8_8_ = extraout_XMM1_Qb_00;
      in_XMM1._0_8_ = extraout_XMM1_Qa_00;
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar3) goto LAB_00946c27;
      *puVar5 = 0;
    }
    pMVar6 = (ModuleFunctionTable *)
             Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                       (this_00,size);
    if (pMVar6 == (ModuleFunctionTable *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      in_XMM1._8_8_ = extraout_XMM1_Qb_01;
      in_XMM1._0_8_ = extraout_XMM1_Qa_01;
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar3) {
LAB_00946c27:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    auVar2 = _DAT_00fa8550;
    uVar7 = sVar10 + 0xfffffffffffffff & 0xfffffffffffffff;
    auVar11._8_4_ = (int)uVar7;
    auVar11._0_8_ = uVar7;
    auVar11._12_4_ = (int)(uVar7 >> 0x20);
    pTVar8 = &pMVar6[1].moduleFunctionIndex;
    uVar9 = 0;
    auVar12 = pmovsxbq(in_XMM1,0x100);
    auVar11 = auVar11 | _DAT_00fa8550;
    do {
      if ((bool)(~(auVar11._0_8_ < (long)(uVar9 ^ auVar2._0_8_)) & 1)) {
        pTVar8[-2] = (uint *)0x0;
      }
      auVar13._8_4_ = (int)uVar9;
      auVar13._0_8_ = uVar9;
      auVar13._12_4_ = (int)(uVar9 >> 0x20);
      if ((long)((auVar13._8_8_ | auVar12._8_8_) ^ auVar2._8_8_) <= auVar11._8_8_) {
        pTVar8->ptr = (uint *)0x0;
      }
      uVar9 = uVar9 + 2;
      pTVar8 = pTVar8 + 4;
    } while ((uVar7 - ((uint)(sVar10 + 0xfffffffffffffff) & 1)) + 2 != uVar9);
  }
  addr = &this->mFunctionTables;
  Memory::Recycler::WBSetBit((char *)addr);
  addr->ptr = pMVar6;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  return;
}

Assistant:

void AsmJsModuleInfo::SetFunctionTableCount(int val)
    {
        Assert(mFunctionTables == nullptr);
        mFunctionTableCount = val;
        mFunctionTables = RecyclerNewArray(mRecycler, ModuleFunctionTable, val);
    }